

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
          (QMovableArrayOps<QCss::StyleRule> *this,qsizetype i,StyleRule *args)

{
  StyleRule **ppSVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_90;
  StyleRule tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QCss::StyleRule>).super_QArrayDataPointer<QCss::StyleRule>.
           d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QCss::StyleRule>).super_QArrayDataPointer<QCss::StyleRule>.
        size == i) {
      qVar5 = QArrayDataPointer<QCss::StyleRule>::freeSpaceAtEnd
                        ((QArrayDataPointer<QCss::StyleRule> *)this);
      if (qVar5 == 0) goto LAB_00369d47;
      QCss::StyleRule::StyleRule
                ((this->super_QGenericArrayOps<QCss::StyleRule>).
                 super_QArrayDataPointer<QCss::StyleRule>.ptr +
                 (this->super_QGenericArrayOps<QCss::StyleRule>).
                 super_QArrayDataPointer<QCss::StyleRule>.size,args);
LAB_00369e44:
      pqVar2 = &(this->super_QGenericArrayOps<QCss::StyleRule>).
                super_QArrayDataPointer<QCss::StyleRule>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00369e03;
    }
LAB_00369d47:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QCss::StyleRule>::freeSpaceAtBegin
                        ((QArrayDataPointer<QCss::StyleRule> *)this);
      if (qVar5 != 0) {
        QCss::StyleRule::StyleRule
                  ((this->super_QGenericArrayOps<QCss::StyleRule>).
                   super_QArrayDataPointer<QCss::StyleRule>.ptr + -1,args);
        ppSVar1 = &(this->super_QGenericArrayOps<QCss::StyleRule>).
                   super_QArrayDataPointer<QCss::StyleRule>.ptr;
        *ppSVar1 = *ppSVar1 + -1;
        goto LAB_00369e44;
      }
    }
  }
  tmp._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.declarations.d.ptr = (Declaration *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.declarations.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.selectors.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.declarations.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.selectors.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.selectors.d.ptr = (Selector *)&DAT_aaaaaaaaaaaaaaaa;
  QCss::StyleRule::StyleRule(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QCss::StyleRule>).super_QArrayDataPointer<QCss::StyleRule>.
          size != 0;
  QArrayDataPointer<QCss::StyleRule>::detachAndGrow
            ((QArrayDataPointer<QCss::StyleRule> *)this,(uint)(i == 0 && bVar6),1,(StyleRule **)0x0,
             (QArrayDataPointer<QCss::StyleRule> *)0x0);
  if (i == 0 && bVar6) {
    QCss::StyleRule::StyleRule
              ((this->super_QGenericArrayOps<QCss::StyleRule>).
               super_QArrayDataPointer<QCss::StyleRule>.ptr + -1,&tmp);
    ppSVar1 = &(this->super_QGenericArrayOps<QCss::StyleRule>).
               super_QArrayDataPointer<QCss::StyleRule>.ptr;
    *ppSVar1 = *ppSVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QCss::StyleRule>).
              super_QArrayDataPointer<QCss::StyleRule>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_90,(QArrayDataPointer<QCss::StyleRule> *)this,i,1);
    QCss::StyleRule::StyleRule(local_90.displaceFrom,&tmp);
    local_90.displaceFrom = local_90.displaceFrom + 1;
    (local_90.data)->size = (local_90.data)->size + local_90.nInserts;
  }
  QCss::StyleRule::~StyleRule(&tmp);
LAB_00369e03:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }